

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O3

void __thiscall
bloaty::Rollup::SortAndAggregateRows
          (Rollup *this,RollupRow *row,Rollup *base,Options *options,bool is_toplevel)

{
  vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_> *this_00;
  int64_t *buffer;
  uint uVar1;
  size_t __n;
  ulong uVar2;
  long lVar3;
  Arg *pAVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  Nonnull<char_*> pcVar8;
  const_iterator cVar9;
  Rollup *base_00;
  __normal_iterator<bloaty::RollupRow_*,_std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>_>
  _Var10;
  Rollup *pRVar11;
  ulong uVar12;
  Arg *pAVar13;
  __normal_iterator<bloaty::RollupRow_*,_std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>_>
  _Var14;
  ulong uVar15;
  Arg *pAVar16;
  undefined7 in_register_00000081;
  Arg *a0;
  size_t in_R9;
  Rollup *this_01;
  iterator __end2;
  __normal_iterator<bloaty::RollupRow_*,_std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>_>
  _Var17;
  pointer pRVar18;
  long lVar19;
  iterator __begin2;
  pointer pRVar20;
  bool bVar21;
  double dVar22;
  string_view format;
  string_view format_00;
  Rollup others_base;
  RollupRow others_row;
  Rollup others_rollup;
  string local_1d8;
  Rollup local_1b8;
  value_type local_150;
  Rollup local_c8;
  size_type local_68;
  int64_t *local_60;
  
  this_00 = &row->sorted_children;
  if ((((int)CONCAT71(in_register_00000081,is_toplevel) == 0) &&
      (pRVar20 = (row->sorted_children).
                 super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
                 super__Vector_impl_data._M_start,
      (long)(row->sorted_children).
            super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)pRVar20 == 0x88)) &&
     ((iVar6 = std::__cxx11::string::compare((char *)pRVar20), iVar6 == 0 ||
      (iVar6 = std::__cxx11::string::compare
                         ((char *)(this_00->
                                  super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>
                                  )._M_impl.super__Vector_impl_data._M_start), iVar6 == 0)))) {
    std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::_M_erase_at_end
              (this_00,(this_00->
                       super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>).
                       _M_impl.super__Vector_impl_data._M_start);
  }
  _Var17._M_current =
       (row->sorted_children).
       super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
       super__Vector_impl_data._M_start;
  _Var14._M_current =
       (row->sorted_children).
       super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if ((((long)_Var14._M_current - (long)_Var17._M_current == 0x88) &&
      (__n = ((_Var17._M_current)->name)._M_string_length, __n == (row->name)._M_string_length)) &&
     ((__n == 0 ||
      (iVar6 = bcmp(((_Var17._M_current)->name)._M_dataplus._M_p,(row->name)._M_dataplus._M_p,__n),
      iVar6 == 0)))) {
    std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::_M_erase_at_end
              (this_00,_Var17._M_current);
    _Var17._M_current =
         (row->sorted_children).
         super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
         super__Vector_impl_data._M_start;
    _Var14._M_current =
         (row->sorted_children).
         super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  if (_Var17._M_current == _Var14._M_current) {
    return;
  }
  uVar1 = options->sort_by_;
  _Var10._M_current = _Var17._M_current;
  if (2 < uVar1) {
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/bloaty.cc",
                  0x1e3,
                  "void bloaty::Rollup::SortAndAggregateRows(RollupRow *, const Rollup *, const Options &, bool) const"
                 );
  }
  do {
    if (uVar1 == 2) {
      uVar7 = ((_Var10._M_current)->size).file;
LAB_0017335f:
      uVar12 = -uVar7;
      if (0 < (long)uVar7) {
        uVar12 = uVar7;
      }
    }
    else {
      if (uVar1 == 1) {
        uVar7 = ((_Var10._M_current)->size).vm;
        goto LAB_0017335f;
      }
      uVar7 = ((_Var10._M_current)->size).vm;
      uVar2 = ((_Var10._M_current)->size).file;
      uVar15 = -uVar7;
      if (0 < (long)uVar7) {
        uVar15 = uVar7;
      }
      uVar12 = -uVar2;
      if (0 < (long)uVar2) {
        uVar12 = uVar2;
      }
      if (uVar12 < uVar15) {
        uVar12 = uVar15;
      }
    }
    (_Var10._M_current)->sortkey = uVar12;
    _Var10._M_current = _Var10._M_current + 1;
  } while (_Var10._M_current != _Var14._M_current);
  uVar7 = ((long)_Var14._M_current - (long)_Var17._M_current >> 3) * -0xf0f0f0f0f0f0f0f;
  lVar19 = 0x3f;
  if (uVar7 != 0) {
    for (; uVar7 >> lVar19 == 0; lVar19 = lVar19 + -1) {
    }
  }
  std::
  __introsort_loop<__gnu_cxx::__normal_iterator<bloaty::RollupRow*,std::vector<bloaty::RollupRow,std::allocator<bloaty::RollupRow>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(bloaty::RollupRow_const&,bloaty::RollupRow_const&)>>
            (_Var17,_Var14,(ulong)(((uint)lVar19 ^ 0x3f) * 2) ^ 0x7e,
             (_Iter_comp_iter<bool_(*)(const_bloaty::RollupRow_&,_const_bloaty::RollupRow_&)>)
             0x17aaa6);
  std::
  __final_insertion_sort<__gnu_cxx::__normal_iterator<bloaty::RollupRow*,std::vector<bloaty::RollupRow,std::allocator<bloaty::RollupRow>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(bloaty::RollupRow_const&,bloaty::RollupRow_const&)>>
            (_Var17,_Var14,
             (_Iter_comp_iter<bool_(*)(const_bloaty::RollupRow_&,_const_bloaty::RollupRow_&)>)
             0x17aaa6);
  local_150.name._M_dataplus._M_p = (pointer)&local_150.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_150,others_label_abi_cxx11_,DAT_006910b8 + others_label_abi_cxx11_);
  local_150.filtered_size.vm = 0;
  local_150.filtered_size.file = 0;
  local_150.size.vm = 0;
  local_150.size.file = 0;
  local_150.old_size.vm = 0;
  local_150.old_size.file = 0;
  local_150.sorted_children.
  super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_150.sorted_children.
  super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_150.sorted_children.
  super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_150.other_count =
       ((long)(row->sorted_children).
              super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(row->sorted_children).
              super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
              super__Vector_impl_data._M_start >> 3) * -0xf0f0f0f0f0f0f0f -
       options->max_rows_per_level_;
  buffer = &local_c8.filtered_vm_total_;
  pcVar8 = absl::numbers_internal::FastIntToBuffer(local_150.other_count,(Nonnull<char_*>)buffer);
  local_c8.vm_total_ = (long)pcVar8 - (long)buffer;
  local_1b8.file_total_ = 0;
  local_1b8.filtered_vm_total_ = local_1b8.filtered_vm_total_ & 0xffffffffffffff00;
  a0 = (Arg *)0x1;
  format._M_str = (char *)&local_68;
  format._M_len = (size_t)"[$0 Others]";
  local_1b8.vm_total_ = (int64_t)&local_1b8.filtered_vm_total_;
  local_c8.file_total_ = (int64_t)buffer;
  local_68 = local_c8.vm_total_;
  local_60 = buffer;
  absl::substitute_internal::SubstituteAndAppendArray
            ((substitute_internal *)&local_1b8,(Nonnull<std::string_*>)0xb,format,
             (Nullable<const_absl::string_view_*>)0x1,in_R9);
  pRVar11 = &local_1b8;
  std::__cxx11::string::operator=((string *)&local_150,(string *)pRVar11);
  if ((int64_t *)local_1b8.vm_total_ != &local_1b8.filtered_vm_total_) {
    operator_delete((void *)local_1b8.vm_total_,local_1b8.filtered_vm_total_ + 1);
  }
  local_c8.children_._M_h._M_buckets = &local_c8.children_._M_h._M_single_bucket;
  local_c8.filter_regex_ = (ReImpl *)0x0;
  local_c8.filtered_vm_total_ = 0;
  local_c8.filtered_file_total_ = 0;
  local_c8.vm_total_ = 0;
  local_c8.file_total_ = 0;
  local_c8.children_._M_h._M_bucket_count = 1;
  local_c8.children_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_c8.children_._M_h._M_element_count = 0;
  local_c8.children_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_c8.children_._M_h._M_rehash_policy._M_next_resize = 0;
  local_c8.children_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_1b8.children_._M_h._M_buckets = &local_1b8.children_._M_h._M_single_bucket;
  local_1b8.filter_regex_ = (ReImpl *)0x0;
  local_1b8.filtered_vm_total_ = 0;
  local_1b8.filtered_file_total_ = 0;
  local_1b8.vm_total_ = 0;
  local_1b8.file_total_ = 0;
  local_1b8.children_._M_h._M_bucket_count = 1;
  local_1b8.children_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1b8.children_._M_h._M_element_count = 0;
  local_1b8.children_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_1b8.children_._M_h._M_rehash_policy._M_next_resize = 0;
  local_1b8.children_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  lVar19 = (long)(row->sorted_children).
                 super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(row->sorted_children).
                 super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
                 super__Vector_impl_data._M_start;
  uVar7 = (lVar19 >> 3) * -0xf0f0f0f0f0f0f0f;
  while( true ) {
    uVar7 = uVar7 - 1;
    if (uVar7 < (ulong)options->max_rows_per_level_) break;
    pRVar20 = (this_00->super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>).
              _M_impl.super__Vector_impl_data._M_start;
    lVar3 = *(long *)((long)&pRVar20[-1].size.vm + lVar19);
    bVar21 = SCARRY8(local_150.size.vm,lVar3);
    local_150.size.vm = local_150.size.vm + lVar3;
    if ((bVar21) ||
       (lVar3 = *(long *)((long)&pRVar20[-1].size.file + lVar19),
       bVar21 = SCARRY8(local_150.size.file,lVar3),
       local_150.size.file = local_150.size.file + lVar3, bVar21)) goto LAB_00173901;
    if ((base != (Rollup *)0x0) &&
       (cVar9 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&(base->children_)._M_h,
                       (key_type *)((long)&pRVar20[-1].name._M_dataplus._M_p + lVar19)),
       cVar9.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_true>
       ._M_cur != (__node_type *)0x0)) {
      lVar3 = **(long **)((long)cVar9.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_true>
                                ._M_cur + 0x28);
      bVar21 = SCARRY8(local_1b8.vm_total_,lVar3);
      local_1b8.vm_total_ = local_1b8.vm_total_ + lVar3;
      if ((bVar21) ||
         (lVar3 = (*(long **)((long)cVar9.
                                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_true>
                                    ._M_cur + 0x28))[1],
         bVar21 = SCARRY8(local_1b8.file_total_,lVar3),
         local_1b8.file_total_ = local_1b8.file_total_ + lVar3, bVar21)) {
        Throw("integer overflow",0x7e);
      }
    }
    std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::_M_erase
              (this_00,(row->sorted_children).
                       super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>.
                       _M_impl.super__Vector_impl_data._M_finish + -1);
    lVar19 = lVar19 + -0x88;
  }
  if (local_150.size.file != 0 || local_150.size.vm != 0) {
    std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::push_back
              (this_00,&local_150);
    bVar21 = SCARRY8(local_c8.vm_total_,local_150.size.vm);
    local_c8.vm_total_ = local_c8.vm_total_ + local_150.size.vm;
    if ((bVar21) ||
       (bVar21 = SCARRY8(local_c8.file_total_,local_150.size.file),
       local_c8.file_total_ = local_c8.file_total_ + local_150.size.file, bVar21)) {
LAB_00173901:
      Throw("integer overflow",0x7e);
    }
  }
  _Var17._M_current =
       (row->sorted_children).
       super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
       super__Vector_impl_data._M_start;
  _Var14._M_current =
       (row->sorted_children).
       super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (_Var17._M_current != _Var14._M_current) {
    uVar1 = options->sort_by_;
    _Var10._M_current = _Var17._M_current;
    if (2 < uVar1) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/bloaty.cc"
                    ,0x218,
                    "void bloaty::Rollup::SortAndAggregateRows(RollupRow *, const Rollup *, const Options &, bool) const"
                   );
    }
    do {
      if (uVar1 == 2) {
        pAVar13 = (Arg *)((_Var10._M_current)->size).file;
LAB_001736cb:
        (_Var10._M_current)->sortkey = (int64_t)pAVar13;
      }
      else {
        if (uVar1 == 1) {
          pAVar13 = (Arg *)((_Var10._M_current)->size).vm;
          goto LAB_001736cb;
        }
        pAVar13 = (Arg *)((_Var10._M_current)->size).vm;
        pAVar4 = (Arg *)((_Var10._M_current)->size).file;
        pAVar16 = (Arg *)-(long)pAVar13;
        if (0 < (long)pAVar13) {
          pAVar16 = pAVar13;
        }
        a0 = (Arg *)-(long)pAVar4;
        if (0 < (long)pAVar4) {
          a0 = pAVar4;
        }
        if (a0 < pAVar16) goto LAB_001736cb;
        (_Var10._M_current)->sortkey = (int64_t)pAVar4;
      }
      _Var10._M_current = _Var10._M_current + 1;
    } while (_Var10._M_current != _Var14._M_current);
    if (_Var17._M_current != _Var14._M_current) {
      uVar7 = ((long)_Var14._M_current - (long)_Var17._M_current >> 3) * -0xf0f0f0f0f0f0f0f;
      lVar19 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar19 == 0; lVar19 = lVar19 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<bloaty::RollupRow*,std::vector<bloaty::RollupRow,std::allocator<bloaty::RollupRow>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(bloaty::RollupRow_const&,bloaty::RollupRow_const&)>>
                (_Var17,_Var14,(ulong)(((uint)lVar19 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<bool_(*)(const_bloaty::RollupRow_&,_const_bloaty::RollupRow_&)>)
                 0x17aaa6);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<bloaty::RollupRow*,std::vector<bloaty::RollupRow,std::allocator<bloaty::RollupRow>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(bloaty::RollupRow_const&,bloaty::RollupRow_const&)>>
                (_Var17,_Var14,
                 (_Iter_comp_iter<bool_(*)(const_bloaty::RollupRow_&,_const_bloaty::RollupRow_&)>)
                 0x17aaa6);
    }
  }
  pRVar20 = (row->sorted_children).
            super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
            super__Vector_impl_data._M_start;
  pRVar18 = (row->sorted_children).
            super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (base == (Rollup *)0x0) {
    if (pRVar20 == pRVar18) goto LAB_001738a7;
    lVar19 = (row->size).vm;
    lVar3 = (row->size).file;
    do {
      lVar5 = (pRVar20->size).vm;
      if (lVar19 == 0) {
        dVar22 = NAN;
        if (lVar5 != 0) {
          dVar22 = *(double *)(&DAT_002fc2c0 + (ulong)(0 < lVar5) * 8);
        }
      }
      else {
        dVar22 = ((double)lVar5 / (double)lVar19) * 100.0;
      }
      pRVar20->vmpercent = dVar22;
      lVar5 = (pRVar20->size).file;
      if (lVar3 == 0) {
        dVar22 = NAN;
        if (lVar5 != 0) {
          dVar22 = *(double *)(&DAT_002fc2c0 + (ulong)(0 < lVar5) * 8);
        }
      }
      else {
        dVar22 = ((double)lVar5 / (double)lVar3) * 100.0;
      }
      pRVar20->filepercent = dVar22;
      pRVar20 = pRVar20 + 1;
    } while (pRVar20 != pRVar18);
    pRVar20 = (row->sorted_children).
              super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
              super__Vector_impl_data._M_start;
    pRVar18 = (row->sorted_children).
              super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  if (pRVar20 != pRVar18) {
    if (base == (Rollup *)0x0) {
      pRVar11 = (Rollup *)0x0;
    }
    do {
      base_00 = pRVar11;
      this_01 = &local_c8;
      if (pRVar20->other_count < 1) {
        cVar9 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&(this->children_)._M_h,&pRVar20->name);
        if (cVar9.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_true>
            ._M_cur == (__node_type *)0x0) {
          local_60 = (int64_t *)(pRVar20->name)._M_dataplus._M_p;
          local_68 = (pRVar20->name)._M_string_length;
          format_00._M_str = (char *)&local_68;
          format_00._M_len = (size_t)"internal error, couldn\'t find name $0";
          absl::Substitute_abi_cxx11_(&local_1d8,(absl *)0x25,format_00,a0);
          Throw(local_1d8._M_dataplus._M_p,0x233);
        }
        this_01 = *(Rollup **)
                   ((long)cVar9.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_true>
                          ._M_cur + 0x28);
        if (this_01 == (Rollup *)0x0) {
          __assert_fail("child_rollup",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/bloaty.cc"
                        ,0x236,
                        "void bloaty::Rollup::SortAndAggregateRows(RollupRow *, const Rollup *, const Options &, bool) const"
                       );
        }
        if (base == (Rollup *)0x0) {
          base_00 = (Rollup *)0x0;
        }
        else {
          cVar9 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find(&(base->children_)._M_h,&pRVar20->name);
          if (cVar9.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_true>
              ._M_cur == (__node_type *)0x0) {
            base_00 = GetEmpty();
          }
          else {
            base_00 = *(Rollup **)
                       ((long)cVar9.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_true>
                              ._M_cur + 0x28);
          }
        }
      }
      a0 = (Arg *)0x0;
      CreateRows(this_01,pRVar20,base_00,options,false);
      pRVar20 = pRVar20 + 1;
    } while (pRVar20 != pRVar18);
  }
LAB_001738a7:
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_1b8.children_._M_h);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<bloaty::Rollup,_std::default_delete<bloaty::Rollup>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_c8.children_._M_h);
  std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::~vector
            (&local_150.sorted_children);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150.name._M_dataplus._M_p != &local_150.name.field_2) {
    operator_delete(local_150.name._M_dataplus._M_p,local_150.name.field_2._M_allocated_capacity + 1
                   );
  }
  return;
}

Assistant:

void Rollup::SortAndAggregateRows(RollupRow* row, const Rollup* base,
                                  const Options& options,
                                  bool is_toplevel) const {
  std::vector<RollupRow>& child_rows = row->sorted_children;

  // We don't want to output a solitary "[None]" or "[Unmapped]" row except at
  // the top level.
  if (!is_toplevel && child_rows.size() == 1 &&
      (child_rows[0].name == "[None]" || child_rows[0].name == "[Unmapped]")) {
    child_rows.clear();
  }

  // We don't want to output a single row that has exactly the same size and
  // label as the parent.
  if (child_rows.size() == 1 && child_rows[0].name == row->name) {
    child_rows.clear();
  }

  if (child_rows.empty()) {
    return;
  }

  // First sort by magnitude.
  for (auto& child : child_rows) {
    switch (options.sort_by()) {
      case Options::SORTBY_VMSIZE:
        child.sortkey = std::abs(child.size.vm);
        break;
      case Options::SORTBY_FILESIZE:
        child.sortkey = std::abs(child.size.file);
        break;
      case Options::SORTBY_BOTH:
        child.sortkey =
            std::max(std::abs(child.size.vm), std::abs(child.size.file));
        break;
      default:
        BLOATY_UNREACHABLE();
    }
  }

  std::sort(child_rows.begin(), child_rows.end(), &RollupRow::Compare);

  RollupRow others_row(others_label);
  others_row.other_count = child_rows.size() - options.max_rows_per_level();
  others_row.name = absl::Substitute("[$0 Others]", others_row.other_count);
  Rollup others_rollup;
  Rollup others_base;

  // Filter out everything but the top 'row_limit'.  Add rows that were filtered
  // out to "others_row".
  size_t i = child_rows.size() - 1;
  while (i >= options.max_rows_per_level()) {
    CheckedAdd(&others_row.size.vm, child_rows[i].size.vm);
    CheckedAdd(&others_row.size.file, child_rows[i].size.file);
    if (base) {
      auto it = base->children_.find(child_rows[i].name);
      if (it != base->children_.end()) {
        CheckedAdd(&others_base.vm_total_, it->second->vm_total_);
        CheckedAdd(&others_base.file_total_, it->second->file_total_);
      }
    }

    child_rows.erase(child_rows.end() - 1);
    i--;
  }

  if (std::abs(others_row.size.vm) > 0 || std::abs(others_row.size.file) > 0) {
    child_rows.push_back(others_row);
    CheckedAdd(&others_rollup.vm_total_, others_row.size.vm);
    CheckedAdd(&others_rollup.file_total_, others_row.size.file);
  }

  // Now sort by actual value (positive or negative).
  for (auto& child : child_rows) {
    switch (options.sort_by()) {
      case Options::SORTBY_VMSIZE:
        child.sortkey = child.size.vm;
        break;
      case Options::SORTBY_FILESIZE:
        child.sortkey = child.size.file;
        break;
      case Options::SORTBY_BOTH:
        if (std::abs(child.size.vm) > std::abs(child.size.file)) {
          child.sortkey = child.size.vm;
        } else {
          child.sortkey = child.size.file;
        }
        break;
      default:
        BLOATY_UNREACHABLE();
    }
  }

  std::sort(child_rows.begin(), child_rows.end(), &RollupRow::Compare);

  // For a non-diff, the percentage is compared to the total size of the parent.
  if (!base) {
    for (auto& child_row : child_rows) {
      child_row.vmpercent = Percent(child_row.size.vm, row->size.vm);
      child_row.filepercent = Percent(child_row.size.file, row->size.file);
    }
  }

  // Recurse into sub-rows, (except "Other", which isn't a real row).
  for (auto& child_row : child_rows) {
    const Rollup* child_rollup;
    const Rollup* child_base = nullptr;

    if (child_row.other_count > 0) {
      child_rollup = &others_rollup;
      if (base) {
        child_base = &others_base;
      }
    } else {
      auto it = children_.find(child_row.name);
      if (it == children_.end()) {
        THROWF("internal error, couldn't find name $0", child_row.name);
      }
      child_rollup = it->second.get();
      assert(child_rollup);

      if (base) {
        auto it = base->children_.find(child_row.name);
        if (it == base->children_.end()) {
          child_base = GetEmpty();
        } else {
          child_base = it->second.get();
        }
      }
    }

    child_rollup->CreateRows(&child_row, child_base, options, false);
  }
}